

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O0

void __thiscall defyx::JitCompilerX86::generateProgramEpilogue(JitCompilerX86 *this,Program *prog)

{
  JitCompilerX86 *in_RSI;
  JitCompilerX86 *in_RDI;
  
  memcpy(in_RDI->code + in_RDI->codePos,codeLoopStore,(long)loopStoreSize);
  in_RDI->codePos = loopStoreSize + in_RDI->codePos;
  emit<3ul>(in_RSI,(uint8_t (*) [3])in_RDI);
  emit<2ul>(in_RSI,(uint8_t (*) [2])in_RDI);
  emit32(in_RDI,(prologueSize - in_RDI->codePos) - 4);
  emitByte(in_RDI,0xe9);
  emit32(in_RDI,(epilogueOffset - in_RDI->codePos) - 4);
  return;
}

Assistant:

void JitCompilerX86::generateProgramEpilogue(Program& prog) {
		memcpy(code + codePos, codeLoopStore, loopStoreSize);
		codePos += loopStoreSize;
		emit(SUB_EBX);
		emit(JNZ);
		emit32(prologueSize - codePos - 4);
		emitByte(JMP);
		emit32(epilogueOffset - codePos - 4);
	}